

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# RegexRuntime.cpp
# Opt level: O0

void __thiscall
UnifiedRegex::Matcher::DoSaveInnerGroups
          (Matcher *this,int fromGroupId,int toGroupId,bool reset,Char *input,ContStack *contStack)

{
  code *pcVar1;
  bool bVar2;
  undefined4 *puVar3;
  GroupInfo *this_00;
  RestoreGroupCont *this_01;
  GroupInfo *groupInfo;
  int groupId;
  int undefinedRangeFromId;
  ContStack *contStack_local;
  Char *input_local;
  bool reset_local;
  int toGroupId_local;
  int fromGroupId_local;
  Matcher *this_local;
  
  if (fromGroupId < 0) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar3 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar3 = 1;
    bVar2 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Parser/RegexRuntime.cpp"
                       ,0x10b,"(fromGroupId >= 0)","fromGroupId >= 0");
    if (!bVar2) {
      pcVar1 = (code *)invalidInstructionException();
      (*pcVar1)();
    }
    puVar3 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar3 = 0;
  }
  if (toGroupId < 0) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar3 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar3 = 1;
    bVar2 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Parser/RegexRuntime.cpp"
                       ,0x10c,"(toGroupId >= 0)","toGroupId >= 0");
    if (!bVar2) {
      pcVar1 = (code *)invalidInstructionException();
      (*pcVar1)();
    }
    puVar3 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar3 = 0;
  }
  if (toGroupId < fromGroupId) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar3 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar3 = 1;
    bVar2 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Parser/RegexRuntime.cpp"
                       ,0x10d,"(fromGroupId <= toGroupId)","fromGroupId <= toGroupId");
    if (!bVar2) {
      pcVar1 = (code *)invalidInstructionException();
      (*pcVar1)();
    }
    puVar3 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar3 = 0;
  }
  groupInfo._4_4_ = -1;
  groupInfo._0_4_ = fromGroupId;
  do {
    this_00 = GroupIdToGroupInfo(this,(int)groupInfo);
    bVar2 = GroupInfo::IsUndefined(this_00);
    if (bVar2) {
      if (groupInfo._4_4_ < 0) {
        groupInfo._4_4_ = (int)groupInfo;
      }
    }
    else {
      if (-1 < groupInfo._4_4_) {
        if ((int)groupInfo < 1) {
          AssertCount = AssertCount + 1;
          Js::Throw::LogAssert();
          puVar3 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
          *puVar3 = 1;
          bVar2 = Js::Throw::ReportAssert
                            ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Parser/RegexRuntime.cpp"
                             ,0x11f,"(groupId > 0)","groupId > 0");
          if (!bVar2) {
            pcVar1 = (code *)invalidInstructionException();
            (*pcVar1)();
          }
          puVar3 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
          *puVar3 = 0;
        }
        DoSaveInnerGroups_AllUndefined(this,groupInfo._4_4_,(int)groupInfo + -1,input,contStack);
        groupInfo._4_4_ = -1;
      }
      this_01 = (RestoreGroupCont *)
                ContinuousPageStackOfVariableElements<UnifiedRegex::Cont,_1UL>::
                Push<UnifiedRegex::RestoreGroupCont>
                          (&contStack->
                            super_ContinuousPageStackOfVariableElements<UnifiedRegex::Cont,_1UL>);
      RestoreGroupCont::RestoreGroupCont(this_01,(int)groupInfo,this_00);
      PushStats(this,contStack,input);
      if (reset) {
        GroupInfo::Reset(this_00);
      }
    }
    groupInfo._0_4_ = (int)groupInfo + 1;
  } while ((int)groupInfo <= toGroupId);
  if (-1 < groupInfo._4_4_) {
    if (toGroupId < 0) {
      AssertCount = AssertCount + 1;
      Js::Throw::LogAssert();
      puVar3 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
      *puVar3 = 1;
      bVar2 = Js::Throw::ReportAssert
                        ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Parser/RegexRuntime.cpp"
                         ,0x130,"(toGroupId >= 0)","toGroupId >= 0");
      if (!bVar2) {
        pcVar1 = (code *)invalidInstructionException();
        (*pcVar1)();
      }
      puVar3 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
      *puVar3 = 0;
    }
    DoSaveInnerGroups_AllUndefined(this,groupInfo._4_4_,toGroupId,input,contStack);
  }
  return;
}

Assistant:

void Matcher::DoSaveInnerGroups(
        const int fromGroupId,
        const int toGroupId,
        const bool reset,
        const Char *const input,
        ContStack &contStack)
    {
        Assert(fromGroupId >= 0);
        Assert(toGroupId >= 0);
        Assert(fromGroupId <= toGroupId);

        int undefinedRangeFromId = -1;
        int groupId = fromGroupId;
        do
        {
            GroupInfo *const groupInfo = GroupIdToGroupInfo(groupId);
            if (groupInfo->IsUndefined())
            {
                if (undefinedRangeFromId < 0)
                {
                    undefinedRangeFromId = groupId;
                }
                continue;
            }

            if (undefinedRangeFromId >= 0)
            {
                Assert(groupId > 0);
                DoSaveInnerGroups_AllUndefined(undefinedRangeFromId, groupId - 1, input, contStack);
                undefinedRangeFromId = -1;
            }

            PUSH(contStack, RestoreGroupCont, groupId, *groupInfo);
#if ENABLE_REGEX_CONFIG_OPTIONS
            PushStats(contStack, input);
#endif

            if (reset)
            {
                groupInfo->Reset();
            }
        } while (++groupId <= toGroupId);
        if (undefinedRangeFromId >= 0)
        {
            Assert(toGroupId >= 0);
            DoSaveInnerGroups_AllUndefined(undefinedRangeFromId, toGroupId, input, contStack);
        }
    }